

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToggleTiles.cpp
# Opt level: O0

void __thiscall commands::ToggleTiles::execute(ToggleTiles *this)

{
  size_type sVar1;
  long in_RDI;
  Tile tile;
  size_t i;
  undefined7 in_stack_ffffffffffffffb8;
  t in_stack_ffffffffffffffbf;
  Command *in_stack_ffffffffffffffc0;
  Board *this_00;
  undefined8 local_10;
  
  Command::execute(in_stack_ffffffffffffffc0);
  local_10 = 0;
  while( true ) {
    sVar1 = std::
            vector<commands::ToggleTiles::ToggleData,_std::allocator<commands::ToggleTiles::ToggleData>_>
            ::size((vector<commands::ToggleTiles::ToggleData,_std::allocator<commands::ToggleTiles::ToggleData>_>
                    *)(in_RDI + 0x18));
    if (sVar1 <= local_10) break;
    this_00 = *(Board **)(in_RDI + 0x10);
    std::
    vector<commands::ToggleTiles::ToggleData,_std::allocator<commands::ToggleTiles::ToggleData>_>::
    operator[]((vector<commands::ToggleTiles::ToggleData,_std::allocator<commands::ToggleTiles::ToggleData>_>
                *)(in_RDI + 0x18),local_10);
    Board::accessTile(this_00,(Vector2i *)
                              CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    std::
    vector<commands::ToggleTiles::ToggleData,_std::allocator<commands::ToggleTiles::ToggleData>_>::
    operator[]((vector<commands::ToggleTiles::ToggleData,_std::allocator<commands::ToggleTiles::ToggleData>_>
                *)(in_RDI + 0x18),local_10);
    Tile::setState((Tile *)this_00,in_stack_ffffffffffffffbf);
    if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
      Tile::setHighlight((Tile *)this_00,(bool)in_stack_ffffffffffffffbf);
    }
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void ToggleTiles::execute() {
    Command::execute();
    for (size_t i = 0; i < toggleData_.size(); ++i) {
        auto tile = board_.accessTile(toggleData_[i].pos);
        tile.setState(toggleData_[i].newState);
        if (highlightTiles_) {
            tile.setHighlight(true);
        }
    }
}